

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Orientation.h
# Opt level: O0

Orientation * __thiscall DIS::Orientation::operator=(Orientation *this,Orientation *param_1)

{
  float fVar1;
  Orientation *param_1_local;
  Orientation *this_local;
  
  fVar1 = param_1->_theta;
  this->_psi = param_1->_psi;
  this->_theta = fVar1;
  this->_phi = param_1->_phi;
  return this;
}

Assistant:

class OPENDIS6_EXPORT Orientation
{
protected:
  float _psi; 

  float _theta; 

  float _phi; 


 public:
    Orientation();
    virtual ~Orientation();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getPsi() const; 
    void setPsi(float pX); 

    float getTheta() const; 
    void setTheta(float pX); 

    float getPhi() const; 
    void setPhi(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const Orientation& rhs) const;
}